

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O2

int __thiscall
RestrictedUdpLayer::receiveUdpPacket
          (RestrictedUdpLayer *this,void *data,int *size,sockaddr_in *from)

{
  int iVar1;
  ushort uVar2;
  _List_node_base *p_Var3;
  
  iVar1 = UdpLayer::receiveUdpPacket(&this->super_UdpLayer,data,size,from);
  if (0 < iVar1) {
    uVar2 = from->sin_port << 8 | from->sin_port >> 8;
    p_Var3 = (_List_node_base *)&this->mLostPorts;
    do {
      p_Var3 = (((_List_base<PortRange,_std::allocator<PortRange>_> *)&p_Var3->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next;
      if (p_Var3 == (_List_node_base *)&this->mLostPorts) {
        return *size;
      }
    } while ((uVar2 < *(ushort *)&p_Var3[1]._M_next) ||
            (*(ushort *)((long)&p_Var3[1]._M_next + 2) < uVar2));
    *size = 0;
  }
  return -1;
}

Assistant:

int RestrictedUdpLayer::receiveUdpPacket(void *data, int *size, struct sockaddr_in &from) {
	if (0 < UdpLayer::receiveUdpPacket(data, size, from)) {
		/* check the port against list */
		uint16_t inPort = ntohs(from.sin_port);

		std::list<PortRange>::iterator it;
		for (it = mLostPorts.begin(); it != mLostPorts.end(); it++) {
			if (it->inRange(inPort)) {
#ifdef DEBUG_UDP_LAYER 	
				std::cerr << "RestrictedUdpLayer::receiveUdpPacket() Dropping packet";
				std::cerr << ", Port(" << inPort << ") in restricted range!";
				std::cerr << std::endl;
				//std::cerr << printPkt(data, *size);
				//std::cerr << std::endl;
#endif

				*size = 0;
				return -1;
	
			}
	
		}

#ifdef DEBUG_UDP_LAYER 	
		std::cerr << "RestrictedUdpLayer::receiveUdpPacket() Accepting packet";
		std::cerr << ", Port(" << inPort << ") in Okay range!";
		std::cerr << std::endl;
#endif
		/* acceptable port */
		return *size;
	}
	return -1;
}